

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_file.cpp
# Opt level: O3

void __thiscall
foxxll::mmap_file::serve
          (mmap_file *this,void *buffer,offset_type offset,size_type bytes,read_or_write op)

{
  int iVar1;
  void *__addr;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *piVar5;
  void *__src;
  scoped_read_write_timer read_write_timer;
  unique_lock<std::mutex> fd_lock;
  ostringstream msg;
  string local_1e8;
  scoped_read_write_timer local_1c8;
  unique_lock<std::mutex> local_1b8;
  ostringstream local_1a8 [376];
  
  local_1b8._M_device = &(this->super_ufs_file_base).fd_mutex_;
  local_1b8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_1b8);
  local_1b8._M_owns = true;
  local_1c8.file_stats_ = *(file_stats **)&this->field_0x88;
  local_1c8.is_write_ = op == WRITE;
  local_1c8.running_ = false;
  file_stats::scoped_read_write_timer::start(&local_1c8,bytes);
  __addr = mmap64((void *)0x0,bytes,2 - (uint)(op == READ),1,(this->super_ufs_file_base).file_des_,
                  offset);
  if (__addr == (void *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "virtual void foxxll::mmap_file::serve(void *, offset_type, size_type, request::read_or_write)"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"mmap() returned nullptr",0x17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<((ostream *)local_1a8,pcVar4);
    piVar5 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::stringbuf::str();
    io_error::io_error(piVar5,&local_1e8);
    __cxa_throw(piVar5,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  if (__addr == (void *)0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "virtual void foxxll::mmap_file::serve(void *, offset_type, size_type, request::read_or_write)"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," mmap() failed.",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," path=",6);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->super_ufs_file_base).filename_._M_dataplus._M_p,
                        (this->super_ufs_file_base).filename_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes=",7);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," Page size: ",0xc);
    sysconf(0x1e);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," offset modulo page size ",0x19);
    sysconf(0x1e);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    piVar5 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::stringbuf::str();
    io_error::io_error(piVar5,&local_1e8);
    __cxa_throw(piVar5,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  __src = __addr;
  if (op != READ) {
    __src = buffer;
    buffer = __addr;
  }
  memcpy(buffer,__src,bytes);
  iVar1 = munmap(__addr,bytes);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "virtual void foxxll::mmap_file::serve(void *, offset_type, size_type, request::read_or_write)"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"munmap() failed",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<((ostream *)local_1a8,pcVar4);
    piVar5 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::stringbuf::str();
    io_error::io_error(piVar5,&local_1e8);
    __cxa_throw(piVar5,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
  }
  if (local_1c8.running_ == true) {
    if (local_1c8.is_write_ == true) {
      file_stats::write_finished(local_1c8.file_stats_);
    }
    else {
      file_stats::read_finished(local_1c8.file_stats_);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_1b8);
  return;
}

Assistant:

void mmap_file::serve(void* buffer, offset_type offset, size_type bytes,
                      request::read_or_write op)
{
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);

    //assert(offset + bytes <= _size());

    file_stats::scoped_read_write_timer read_write_timer(
        file_stats_, bytes, op == request::WRITE);

    int prot = (op == request::READ) ? PROT_READ : PROT_WRITE;
    void* mem = mmap(nullptr, bytes, prot, MAP_SHARED, file_des_, offset);

    if (mem == MAP_FAILED)
    {
        FOXXLL_THROW_ERRNO(
            io_error,
            " mmap() failed." <<
                " path=" << filename_ <<
                " bytes=" << bytes <<
                " Page size: " << sysconf(_SC_PAGESIZE) <<
                " offset modulo page size " << (offset % sysconf(_SC_PAGESIZE))
        );
    }
    else if (mem == 0)
    {
        FOXXLL_THROW_ERRNO(io_error, "mmap() returned nullptr");
    }
    else
    {
        if (op == request::READ)
        {
            memcpy(buffer, mem, bytes);
        }
        else
        {
            memcpy(mem, buffer, bytes);
        }
        FOXXLL_THROW_ERRNO_NE_0(
            munmap(mem, bytes), io_error,
            "munmap() failed"
        );
    }
}